

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array.hpp
# Opt level: O0

void __thiscall
boost::
multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
::allocate_space(multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *this)

{
  vector<AlphaVector,_std::allocator<AlphaVector>_> *pvVar1;
  size_type sVar2;
  const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
  *in_RDI;
  const_pointer no_hint;
  const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
  *__x;
  new_allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *in_stack_ffffffffffffffb0;
  
  __x = in_RDI + 1;
  const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
  ::num_elements(in_RDI);
  pvVar1 = __gnu_cxx::new_allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::
           allocate(in_stack_ffffffffffffffb0,(size_type)in_RDI,__x);
  in_RDI[1].storage_.ordering_.elems[0] = (unsigned_long)pvVar1;
  const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
  ::set_base_ptr(in_RDI,(vector<AlphaVector,_std::allocator<AlphaVector>_> *)
                        in_RDI[1].storage_.ordering_.elems[0]);
  sVar2 = const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
          ::num_elements(in_RDI);
  in_RDI[1].storage_.ordering_.elems[1] = sVar2;
  pvVar1 = (vector<AlphaVector,_std::allocator<AlphaVector>_> *)
           in_RDI[1].storage_.ordering_.elems[0];
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x951ccb);
  std::
  uninitialized_fill_n<std::vector<AlphaVector,std::allocator<AlphaVector>>*,unsigned_long,std::vector<AlphaVector,std::allocator<AlphaVector>>>
            (pvVar1,(unsigned_long)in_RDI,(vector<AlphaVector,_std::allocator<AlphaVector>_> *)__x);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(pvVar1);
  return;
}

Assistant:

void allocate_space() {
    typename Allocator::const_pointer no_hint=0;
    base_ = allocator_.allocate(this->num_elements(),no_hint);
    this->set_base_ptr(base_);
    allocated_elements_ = this->num_elements();
    std::uninitialized_fill_n(base_,allocated_elements_,T());
  }